

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::SetThetaInDegrees(LE_EulerAngles *this,KFIXED8_3 *Theta)

{
  KFIXED<char,_(unsigned_char)__x03_> KStack_38;
  DataTypeBase local_28;
  char local_20;
  KFIXED<char,_(unsigned_char)__x03_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00325e98;
  local_20 = Theta->m_Val;
  UTILS::DegToRad<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>(&KStack_38);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_18,&this->m_Theta);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&KStack_38.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

void LE_EulerAngles::SetThetaInDegrees( KFIXED8_3 Theta )
{
    m_Theta = DegToRad( Theta );
}